

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_generic_tests.cpp
# Opt level: O0

void density_tests::heter_queue_generic_tests
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_rand,size_t i_element_count
               )

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  size_t sVar1;
  size_t sVar2;
  EasyRandom *pEVar3;
  QueueTesterFlags QVar4;
  bool bVar5;
  allocator<unsigned_long> local_149;
  unsigned_long local_148;
  iterator local_140;
  size_type local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_130;
  allocator<unsigned_long> local_111;
  unsigned_long local_110;
  iterator local_108;
  size_type local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  allocator<unsigned_long> local_d9;
  unsigned_long local_d8;
  iterator local_d0;
  size_type local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  allocator<unsigned_long> local_a1;
  unsigned_long local_a0;
  iterator local_98;
  size_type local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  allocator<unsigned_long> local_59;
  unsigned_long local_58;
  iterator local_50;
  size_type local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  size_t local_28;
  size_t i_element_count_local;
  EasyRandom *i_rand_local;
  ostream *i_output_local;
  QueueTesterFlags i_flags_local;
  
  local_28 = i_element_count;
  i_element_count_local = (size_t)i_rand;
  i_rand_local = (EasyRandom *)i_output;
  i_output_local._4_4_ = i_flags;
  bVar5 = operator&&(i_flags,eUseTestAllocators);
  QVar4 = i_output_local._4_4_;
  pEVar3 = i_rand_local;
  sVar2 = i_element_count_local;
  sVar1 = local_28;
  if (bVar5) {
    local_58 = 1;
    local_50 = &local_58;
    local_48 = 1;
    std::allocator<unsigned_long>::allocator(&local_59);
    __l_03._M_len = local_48;
    __l_03._M_array = local_50;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_40,__l_03,&local_59);
    detail::
    single_queue_generic_test<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,sVar1,&local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_40);
    std::allocator<unsigned_long>::~allocator(&local_59);
    QVar4 = i_output_local._4_4_;
    pEVar3 = i_rand_local;
    sVar2 = i_element_count_local;
    sVar1 = local_28;
    local_a0 = 1;
    local_98 = &local_a0;
    local_90 = 1;
    std::allocator<unsigned_long>::allocator(&local_a1);
    __l_02._M_len = local_90;
    __l_02._M_array = local_98;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_88,__l_02,&local_a1);
    detail::
    single_queue_generic_test<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,sVar1,&local_88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_88);
    std::allocator<unsigned_long>::~allocator(&local_a1);
    QVar4 = i_output_local._4_4_;
    pEVar3 = i_rand_local;
    sVar2 = i_element_count_local;
    sVar1 = local_28;
    local_d8 = 1;
    local_d0 = &local_d8;
    local_c8 = 1;
    std::allocator<unsigned_long>::allocator(&local_d9);
    __l_01._M_len = local_c8;
    __l_01._M_array = local_d0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,__l_01,&local_d9);
    detail::
    single_queue_generic_test<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,sVar1,&local_c0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_c0);
    std::allocator<unsigned_long>::~allocator(&local_d9);
    QVar4 = i_output_local._4_4_;
    pEVar3 = i_rand_local;
    sVar2 = i_element_count_local;
    sVar1 = local_28;
    local_110 = 1;
    local_108 = &local_110;
    local_100 = 1;
    std::allocator<unsigned_long>::allocator(&local_111);
    __l_00._M_len = local_100;
    __l_00._M_array = local_108;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_f8,__l_00,&local_111);
    detail::
    single_queue_generic_test<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,sVar1,&local_f8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_f8);
    std::allocator<unsigned_long>::~allocator(&local_111);
  }
  else {
    local_148 = 1;
    local_140 = &local_148;
    local_138 = 1;
    std::allocator<unsigned_long>::allocator(&local_149);
    __l._M_len = local_138;
    __l._M_array = local_140;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_130,__l,&local_149);
    detail::
    single_queue_generic_test<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
              (QVar4,(ostream *)pEVar3,(EasyRandom *)sVar2,sVar1,&local_130);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_130);
    std::allocator<unsigned_long>::~allocator(&local_149);
  }
  return;
}

Assistant:

void heter_queue_generic_tests(
      QueueTesterFlags i_flags,
      std::ostream &   i_output,
      EasyRandom &     i_rand,
      size_t           i_element_count)
    {
        using namespace density;

        if (i_flags && QueueTesterFlags::eUseTestAllocators)
        {
            detail::single_queue_generic_test<
              heter_queue<runtime_type<>, UnmovableFastTestAllocator<>>>(
              i_flags, i_output, i_rand, i_element_count, {1});

            detail::single_queue_generic_test<heter_queue<TestRuntimeTime<>, DeepTestAllocator<>>>(
              i_flags, i_output, i_rand, i_element_count, {1});

            detail::single_queue_generic_test<
              heter_queue<runtime_type<>, UnmovableFastTestAllocator<256>>>(
              i_flags, i_output, i_rand, i_element_count, {1});

            detail::single_queue_generic_test<
              heter_queue<TestRuntimeTime<>, DeepTestAllocator<256>>>(
              i_flags, i_output, i_rand, i_element_count, {1});
        }
        else
        {
            detail::single_queue_generic_test<heter_queue<>>(
              i_flags, i_output, i_rand, i_element_count, {1});
        }
    }